

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

QString * __thiscall
QFileSystemModel::filePath
          (QString *__return_storage_ptr__,QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  Data<QHashPrivate::Node<QString,_QString>_> *this_01;
  Data *pDVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  char cVar4;
  bool bVar5;
  Type TVar6;
  Node<QString,_QString> *pNVar7;
  QFileSystemNode *pQVar8;
  QFileSystemNode *pQVar9;
  long in_FS_OFFSET;
  QFileInfo resolvedInfo;
  QFileInfo fullPathInfo;
  QArrayData *local_88;
  QString local_80;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QArrayData *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModelPrivate::filePath(&local_48,(QFileSystemModelPrivate *)this,index);
  pQVar8 = &this_00->root;
  if ((index->m).ptr != (QAbstractItemModel *)0x0) {
    pQVar8 = (QFileSystemNode *)index->i;
  }
  pQVar9 = &this_00->root;
  if (-1 < (index->c | index->r)) {
    pQVar9 = pQVar8;
  }
  if ((((pQVar9->info != (QExtendedInformation *)0x0) &&
       (cVar4 = QFileInfo::isSymLink(), cVar4 != '\0')) &&
      (bVar5 = QFileInfoGatherer::resolveSymlinks
                         ((QFileInfoGatherer *)
                          (this_00->fileInfoGatherer)._M_t.
                          super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>
                          .super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl), bVar5))
     && ((this_01 = (this_00->resolvedSymLinks).d,
         this_01 != (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 &&
         (pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::findNode<QString>
                             (this_01,&local_48), pNVar7 != (Node<QString,_QString> *)0x0)))) {
    if (pQVar9->info == (QExtendedInformation *)0x0) {
      pDVar1 = (pQVar9->children).d;
      if ((pDVar1 != (Data *)0x0) && (0 < (long)pDVar1->size)) {
LAB_0061176d:
        local_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_50);
        goto LAB_00611777;
      }
    }
    else {
      TVar6 = QExtendedInformation::type(pQVar9->info);
      if (TVar6 == Dir) {
        local_50 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        if (pQVar9->info == (QExtendedInformation *)0x0) goto LAB_0061176d;
        QFileInfo::QFileInfo((QFileInfo *)&local_50,&pQVar9->info->mFileInfo);
LAB_00611777:
        if (pQVar9->info == (QExtendedInformation *)0x0) {
          QFileInfo::QFileInfo((QFileInfo *)&local_68,(QString *)&local_48);
          pQVar3 = local_50;
          local_50 = local_68;
          local_68 = pQVar3;
          QFileInfo::~QFileInfo((QFileInfo *)&local_68);
        }
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        QFileInfo::canonicalFilePath();
        QFileInfo::canonicalFilePath();
        pQVar8 = QFileSystemModelPrivate::node(this_00,&local_80,false);
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_80.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        if (pQVar8->info == (QExtendedInformation *)0x0) {
          QFileInfo::QFileInfo((QFileInfo *)&local_80);
        }
        else {
          QFileInfo::QFileInfo((QFileInfo *)&local_80,&pQVar8->info->mFileInfo);
        }
        if (pQVar8->info == (QExtendedInformation *)0x0) {
          QFileInfo::QFileInfo((QFileInfo *)&local_88,(QString *)&local_68);
          pDVar2 = local_80.d.d;
          local_80.d.d = (Data *)local_88;
          local_88 = &pDVar2->super_QArrayData;
          QFileInfo::~QFileInfo((QFileInfo *)&local_88);
        }
        cVar4 = QFileInfo::exists();
        if (cVar4 != '\0') {
          QFileInfo::filePath();
          QFileInfo::~QFileInfo((QFileInfo *)&local_80);
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_68,2,0x10);
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_50);
          if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_00611922;
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_80);
        if (local_68 != (QArrayData *)0x0) {
          LOCK();
          (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_68,2,0x10);
          }
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_50);
      }
    }
  }
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_48.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_48.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_48.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_48.d.ptr._4_4_;
  (__return_storage_ptr__->d).size = local_48.d.size;
LAB_00611922:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemModel::filePath(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    QString fullPath = d->filePath(index);
    QFileSystemModelPrivate::QFileSystemNode *dirNode = d->node(index);
    if (dirNode->isSymLink()
#if QT_CONFIG(filesystemwatcher)
        && d->fileInfoGatherer->resolveSymlinks()
#endif
        && d->resolvedSymLinks.contains(fullPath)
        && dirNode->isDir()) {
        QFileInfo fullPathInfo(dirNode->fileInfo());
        if (!dirNode->hasInformation())
            fullPathInfo = QFileInfo(fullPath);
        QString canonicalPath = fullPathInfo.canonicalFilePath();
        auto *canonicalNode = d->node(fullPathInfo.canonicalFilePath(), false);
        QFileInfo resolvedInfo = canonicalNode->fileInfo();
        if (!canonicalNode->hasInformation())
            resolvedInfo = QFileInfo(canonicalPath);
        if (resolvedInfo.exists())
            return resolvedInfo.filePath();
    }
    return fullPath;
}